

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O0

bool __thiscall ritobin::io::impl_text_read::TextReader::read_hash(TextReader *this,XXH64 *value)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_pointer pvVar4;
  int in_R8D;
  string_view str;
  XXH64 local_70;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  uint64_t local_38;
  uint64_t result;
  string_view word;
  XXH64 *value_local;
  TextReader *this_local;
  
  word._M_str = (char *)value;
  _result = read_word(this);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&result);
  if (1 < sVar2) {
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)&result,0);
    if ((*pvVar3 == '0') &&
       ((pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                            ((basic_string_view<char,_std::char_traits<char>_> *)&result,1),
        *pvVar3 == 'x' ||
        (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                            ((basic_string_view<char,_std::char_traits<char>_> *)&result,1),
        *pvVar3 == 'X')))) {
      local_38 = 0;
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)&result);
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&result);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_48,pvVar4 + 2,sVar2 - 2);
      str._M_str = (char *)&local_38;
      str._M_len = (size_t)local_48._M_str;
      bVar1 = to_num<unsigned_long>((ritobin *)local_48._M_len,str,(unsigned_long *)0x10,in_R8D);
      if (bVar1) {
        XXH64::XXH64(&local_70,local_38);
        XXH64::operator=((XXH64 *)word._M_str,&local_70);
        XXH64::~XXH64(&local_70);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
    return this_local._7_1_;
  }
  return false;
}

Assistant:

bool read_hash(XXH64& value) noexcept {
            auto const word = read_word();
            if (word.size() < 2) {
                return false;
            }
            if (word[0] != '0' || (word[1] != 'x' && word[1] != 'X')) {
                return false;
            }
            uint64_t result = 0;
            if (to_num({word.data() + 2, word.size() - 2}, result, 16)) {
                value = XXH64{ result };
                return true;
            }
            return false;
        }